

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestParser.cpp
# Opt level: O2

void __thiscall
TestParser_TestPrintStatement_Test::TestParser_TestPrintStatement_Test
          (TestParser_TestPrintStatement_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_001804e8;
  return;
}

Assistant:

TEST(TestParser, TestPrintStatement) {
    Parser parser(Lexer("print a"));
    std::unique_ptr<AST::Stmt> stmt = parser.parse();
    auto* printStmt = dynamic_cast<AST::PrintStmt*>(stmt.get());
    std::unique_ptr<AST::Expr> expr = std::move(printStmt->m_expr);
    auto* ident = dynamic_cast<AST::Identifier*>(expr.get());
    ASSERT_EQ(ident->m_identStr, "a");
}